

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void write_u8_tick(Emulator *e,Address addr,u8 value)

{
  Ticks *pTVar1;
  MemoryTypeAddressPair pair;
  undefined6 in_register_00000032;
  char *func_name;
  
  (e->state).interrupt.if_ = (e->state).interrupt.new_if;
  pTVar1 = &(e->state).ticks;
  *pTVar1 = *pTVar1 + (e->state).cpu_tick;
  func_name = (char *)CONCAT62(in_register_00000032,addr);
  dma_synchronize(e);
  if ((((uint)(char *)CONCAT62(in_register_00000032,addr) & 0xff00) == 0xfe00) &&
     ((e->state).dma.state == DMA_ACTIVE)) {
    HOOK_write_during_dma_ab(e,func_name,addr,(ulong)value);
    return;
  }
  pair = map_address(addr);
  write_u8_pair(e,pair,value);
  return;
}

Assistant:

static void write_u8_tick(Emulator* e, Address addr, u8 value) {
  tick(e);
  write_u8(e, addr, value);
}